

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

bool __thiscall pbrt::SquareMatrix<3>::operator<(SquareMatrix<3> *this,SquareMatrix<3> *m2)

{
  int j;
  int i;
  SquareMatrix<3> *m2_local;
  SquareMatrix<3> *this_local;
  
  i = 0;
  do {
    if (2 < i) {
      return false;
    }
    for (j = 0; j < 3; j = j + 1) {
      if (this->m[i][j] < m2->m[i][j]) {
        return true;
      }
      if (m2->m[i][j] < this->m[i][j]) {
        return false;
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

PBRT_CPU_GPU
    bool operator<(const SquareMatrix<N> &m2) const {
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j) {
                if (m[i][j] < m2.m[i][j])
                    return true;
                if (m[i][j] > m2.m[i][j])
                    return false;
            }
        return false;
    }